

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_tools.h
# Opt level: O2

void __thiscall
ncnn::SafeOrderList<ncnn::ObjectBox>::pop_front(SafeOrderList<ncnn::ObjectBox> *this)

{
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  std::__cxx11::list<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::pop_front(&this->container)
  ;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void pop_front()
  {
    MutexLockGuard guard(mutex);
    container.pop_front();
  }